

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes)

{
  mz_bool mVar1;
  mz_bool status;
  time_t *pFile_time;
  time_t file_modified_time;
  mz_uint64 uncomp_size;
  FILE *pSrc_file;
  mz_uint level_and_flags_local;
  mz_uint16 comment_size_local;
  void *pComment_local;
  char *pSrc_filename_local;
  char *pArchive_name_local;
  mz_zip_archive *pZip_local;
  
  uncomp_size = 0;
  file_modified_time = 0;
  pSrc_file._0_4_ = level_and_flags;
  pSrc_file._6_2_ = comment_size;
  _level_and_flags_local = pComment;
  pComment_local = pSrc_filename;
  pSrc_filename_local = pArchive_name;
  pArchive_name_local = (char *)pZip;
  memset(&pFile_time,0,8);
  mVar1 = mz_zip_get_file_modified_time((char *)pComment_local,(time_t *)&pFile_time);
  if (mVar1 == 0) {
    if (pArchive_name_local != (char *)0x0) {
      pArchive_name_local[0x1c] = '\x17';
      pArchive_name_local[0x1d] = '\0';
      pArchive_name_local[0x1e] = '\0';
      pArchive_name_local[0x1f] = '\0';
    }
    pZip_local._0_4_ = 0;
  }
  else {
    uncomp_size = (mz_uint64)fopen((char *)pComment_local,"rb");
    if ((FILE *)uncomp_size == (FILE *)0x0) {
      if (pArchive_name_local != (char *)0x0) {
        pArchive_name_local[0x1c] = '\x11';
        pArchive_name_local[0x1d] = '\0';
        pArchive_name_local[0x1e] = '\0';
        pArchive_name_local[0x1f] = '\0';
      }
      pZip_local._0_4_ = 0;
    }
    else {
      fseeko((FILE *)uncomp_size,0,2);
      file_modified_time = ftello((FILE *)uncomp_size);
      fseeko((FILE *)uncomp_size,0,0);
      mVar1 = mz_zip_writer_add_cfile
                        ((mz_zip_archive *)pArchive_name_local,pSrc_filename_local,
                         (FILE *)uncomp_size,file_modified_time,(time_t *)&pFile_time,
                         _level_and_flags_local,pSrc_file._6_2_,(mz_uint)pSrc_file,ext_attributes,
                         (char *)0x0,0,(char *)0x0,0);
      fclose((FILE *)uncomp_size);
      pZip_local._0_4_ = mVar1;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size, mz_uint level_and_flags,
                               mz_uint32 ext_attributes) {
  MZ_FILE *pSrc_file = NULL;
  mz_uint64 uncomp_size = 0;
  MZ_TIME_T file_modified_time;
  MZ_TIME_T *pFile_time = NULL;
  mz_bool status;

  memset(&file_modified_time, 0, sizeof(file_modified_time));

#if !defined(MINIZ_NO_TIME) && !defined(MINIZ_NO_STDIO)
  pFile_time = &file_modified_time;
  if (!mz_zip_get_file_modified_time(pSrc_filename, &file_modified_time))
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_STAT_FAILED);
#endif

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  status = mz_zip_writer_add_cfile(
      pZip, pArchive_name, pSrc_file, uncomp_size, pFile_time, pComment,
      comment_size, level_and_flags, ext_attributes, NULL, 0, NULL, 0);

  MZ_FCLOSE(pSrc_file);

  return status;
}